

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

int __thiscall
CLI::Option::_add_result
          (Option *this,string *result,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *res)

{
  char cVar1;
  char *pcVar2;
  pointer pcVar3;
  undefined8 uVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *var_1;
  value_type *pvVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *var;
  string *result_00;
  bool bVar10;
  string nstrs;
  undefined1 local_70 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  undefined1 local_40 [16];
  
  uVar8 = result->_M_string_length;
  iVar5 = 0;
  iVar7 = 0;
  if ((((3 < uVar8) && (pcVar2 = (result->_M_dataplus)._M_p, iVar7 = iVar5, *pcVar2 == '[')) &&
      (pcVar2[1] == '[')) && ((pcVar2[uVar8 - 1] == ']' && (pcVar2[uVar8 - 2] == ']')))) {
    local_70._0_8_ = local_70 + 0x10;
    local_70._16_2_ = 0x5b;
    local_70._8_8_ = (value_type *)0x1;
    bVar10 = result->_M_string_length - 5 < 0xfffffffffffffffd;
    if (bVar10) {
      pcVar3 = (result->_M_dataplus)._M_p;
      iVar7 = 0;
      if (pcVar3[2] == pcVar3[3]) {
        uVar8 = 4;
        do {
          ::std::__cxx11::string::push_back((char)local_70);
          bVar10 = uVar8 < result->_M_string_length - 2;
          if (!bVar10) goto LAB_001376ae;
          pcVar3 = (result->_M_dataplus)._M_p;
          pcVar2 = pcVar3 + uVar8;
          lVar6 = uVar8 + 1;
          uVar8 = uVar8 + 2;
          iVar7 = 0;
        } while (*pcVar2 == pcVar3[lVar6]);
      }
    }
    else {
LAB_001376ae:
      ::std::__cxx11::string::push_back((char)local_70);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)res,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
      iVar7 = 1;
    }
    if ((value_type *)local_70._0_8_ != (value_type *)(local_70 + 0x10)) {
      operator_delete((void *)local_70._0_8_);
    }
    if (!bVar10) {
      return 1;
    }
  }
  if (((this->allow_extra_args_ == false) && (this->expected_max_ < 2)) ||
     ((result->_M_string_length == 0 ||
      ((pcVar2 = (result->_M_dataplus)._M_p, *pcVar2 != '[' ||
       (pcVar2[result->_M_string_length - 1] != ']')))))) {
    cVar1 = (this->super_OptionBase<CLI::Option>).delimiter_;
    if ((cVar1 == '\0') ||
       (lVar6 = ::std::__cxx11::string::find((char)result,(ulong)(uint)(int)cVar1), lVar6 == -1)) {
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)res,result);
      return iVar7 + 1;
    }
    detail::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_70,result,(this->super_OptionBase<CLI::Option>).delimiter_);
    uVar4 = local_70._8_8_;
    for (pvVar9 = (value_type *)local_70._0_8_; pvVar9 != (value_type *)uVar4; pvVar9 = pvVar9 + 1)
    {
      if (pvVar9->_M_string_length != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(res,pvVar9);
        iVar7 = iVar7 + 1;
      }
    }
  }
  else {
    ::std::__cxx11::string::pop_back();
    ::std::__cxx11::string::_M_erase((ulong)result,0);
    pcVar3 = (result->_M_dataplus)._M_p;
    local_50._M_allocated_capacity = (size_type)local_40;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar3,pcVar3 + result->_M_string_length);
    detail::split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_70,(string *)&local_50,',');
    result_00 = (string *)local_70._0_8_;
    pvVar9 = (value_type *)local_70._8_8_;
    if ((undefined1 *)local_50._M_allocated_capacity != local_40) {
      operator_delete((void *)local_50._M_allocated_capacity);
      result_00 = (string *)local_70._0_8_;
      pvVar9 = (value_type *)local_70._8_8_;
    }
    for (; result_00 != pvVar9; result_00 = result_00 + 1) {
      if (result_00->_M_string_length != 0) {
        iVar5 = _add_result(this,result_00,res);
        iVar7 = iVar7 + iVar5;
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_70);
  return iVar7;
}

Assistant:

CLI11_INLINE int Option::_add_result(std::string &&result, std::vector<std::string> &res) const {
    int result_count = 0;

    // Handle the vector escape possibility all characters duplicated and starting with [[ ending with ]]
    // this is always a single result
    if(result.size() >= 4 && result[0] == '[' && result[1] == '[' && result.back() == ']' &&
       (*(result.end() - 2) == ']')) {
        // this is an escape clause for odd strings
        std::string nstrs{'['};
        bool duplicated{true};
        for(std::size_t ii = 2; ii < result.size() - 2; ii += 2) {
            if(result[ii] == result[ii + 1]) {
                nstrs.push_back(result[ii]);
            } else {
                duplicated = false;
                break;
            }
        }
        if(duplicated) {
            nstrs.push_back(']');
            res.push_back(std::move(nstrs));
            ++result_count;
            return result_count;
        }
    }

    if((allow_extra_args_ || get_expected_max() > 1) && !result.empty() && result.front() == '[' &&
       result.back() == ']') {  // this is now a vector string likely from the default or user entry

        result.pop_back();
        result.erase(result.begin());
        bool skipSection{false};
        for(auto &var : CLI::detail::split_up(result, ',')) {
            if(!var.empty()) {
                result_count += _add_result(std::move(var), res);
            }
        }
        if(!skipSection) {
            return result_count;
        }
    }
    if(delimiter_ == '\0') {
        res.push_back(std::move(result));
        ++result_count;
    } else {
        if((result.find_first_of(delimiter_) != std::string::npos)) {
            for(const auto &var : CLI::detail::split(result, delimiter_)) {
                if(!var.empty()) {
                    res.push_back(var);
                    ++result_count;
                }
            }
        } else {
            res.push_back(std::move(result));
            ++result_count;
        }
    }
    return result_count;
}